

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *__buf;
  ostream *poVar1;
  ulong uVar2;
  vector<poly,_std::allocator<poly>_> local_210;
  vector<int,_std::allocator<int>_> local_1f8;
  undefined1 local_1e0 [8];
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> results;
  undefined1 local_1c0 [7];
  LagrangePolynomial lp;
  vector<poly,_std::allocator<poly>_> basis_p;
  undefined1 local_190 [8];
  BasisPolynomial bp;
  char pwd [256];
  string path;
  int local_58;
  int local_54;
  int local_50;
  int k;
  int i;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> data_x;
  vector<int,_std::allocator<int>_> data_y;
  int n;
  
  data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::operator<<((ostream *)&std::cout,"Enter number of terms(n): ");
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if ((int)data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"That\'s Invalid. Please don\'t mess around :-(")
    ;
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    std::operator<<((ostream *)&std::cout,"Enter the first n terms of the series: ");
    for (local_50 = 0;
        local_50 <
        (int)data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage; local_50 = local_50 + 1) {
      std::istream::operator>>((istream *)&std::cin,&local_54);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_54);
      local_58 = local_50 + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_40,&local_58);
    }
    std::__cxx11::string::string((string *)(pwd + 0xf8));
    std::operator<<((ostream *)&std::cout,
                    "Enter destination for source files [Current folder if empty]:");
    std::istream::ignore();
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)(pwd + 0xf8));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      __buf = &bp.data_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      getcwd((char *)__buf,0xff);
      std::__cxx11::string::operator=((string *)(pwd + 0xf8),(char *)__buf);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Using path: ");
    poVar1 = std::operator<<(poVar1,(string *)(pwd + 0xf8));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &basis_p.super__Vector_base<poly,_std::allocator<poly>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<int,_std::allocator<int>_> *)local_40);
    BasisPolynomial::BasisPolynomial
              ((BasisPolynomial *)local_190,
               (vector<int,_std::allocator<int>_> *)
               &basis_p.super__Vector_base<poly,_std::allocator<poly>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &basis_p.super__Vector_base<poly,_std::allocator<poly>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    BasisPolynomial::get_all_basis_polynomials
              ((vector<poly,_std::allocator<poly>_> *)local_1c0,(BasisPolynomial *)local_190);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1f8,
               (vector<int,_std::allocator<int>_> *)
               &data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    std::vector<poly,_std::allocator<poly>_>::vector
              (&local_210,(vector<poly,_std::allocator<poly>_> *)local_1c0);
    LagrangePolynomial::get_lagrange_polynomial
              ((vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *)
               local_1e0,
               (LagrangePolynomial *)
               ((long)&results.
                       super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_1f8,&local_210
              );
    std::vector<poly,_std::allocator<poly>_>::~vector(&local_210);
    std::vector<int,_std::allocator<int>_>::~vector(&local_1f8);
    generate_all_programs
              ((vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *)
               local_1e0,(string *)(pwd + 0xf8));
    poVar1 = std::operator<<((ostream *)&std::cout,"\nDone. May the force be with you :-)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::~vector
              ((vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *)
               local_1e0);
    std::vector<poly,_std::allocator<poly>_>::~vector
              ((vector<poly,_std::allocator<poly>_> *)local_1c0);
    BasisPolynomial::~BasisPolynomial((BasisPolynomial *)local_190);
    std::__cxx11::string::~string((string *)(pwd + 0xf8));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &data_x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
  }
  return data_y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
    int n;
    cout << "Enter number of terms(n): ";
    cin >> n ;

    if(n<=0){ // If the user enters a character, it will still be 0
        cout << "That's Invalid. Please don't mess around :-(" << endl;
        return 0;
    }

    vector<int> data_y; // f(x)
    vector<int> data_x; // x

    cout << "Enter the first n terms of the series: ";
    for(int i=0; i<n; i++){
        int k;
        cin >> k;
        data_y.push_back(k);
        data_x.push_back(i+1);
    }

    string path;
    cout << "Enter destination for source files [Current folder if empty]:";

    cin.ignore();
    getline(cin,path);
    if (path.empty()){
        char pwd[256];
        getcwd(pwd, 255);
        path = pwd;
    }
    cout << "Using path: " << path << endl;

    BasisPolynomial bp(data_x); // generating basis polynomials
    vector<poly> basis_p = bp.get_all_basis_polynomials();

    LagrangePolynomial lp; // generating the lagrange polynomial
    vector<LagrangePolynomial::element> results = lp.get_lagrange_polynomial(data_y,basis_p);

    generate_all_programs(results,path);
    cout << "\nDone. May the force be with you :-)" << endl;

    return 0;
}